

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryMesh(aiMesh *mesh)

{
  uint *w;
  aiFace *paVar1;
  aiVector3t<float> *paVar2;
  aiColor4t<float> *in;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  size_t sVar9;
  size_t sVar10;
  uint n;
  long lVar11;
  uint uVar12;
  uint a_1;
  uint i;
  ulong uVar13;
  uint a;
  uint n_2;
  uint uVar14;
  ulong uVar15;
  uint32_t hash;
  uint local_6c;
  ulong local_68;
  uint32_t tmp;
  ulong local_58;
  uint32_t local_50;
  uint local_4c;
  uint *local_48;
  aiMesh *local_40;
  uint *local_38;
  
  local_50 = WriteMagic(0x1237);
  uVar3 = Write<unsigned_int>(&mesh->mPrimitiveTypes);
  w = &mesh->mNumVertices;
  uVar4 = Write<unsigned_int>(w);
  local_48 = &mesh->mNumFaces;
  uVar5 = Write<unsigned_int>(local_48);
  local_38 = &mesh->mNumBones;
  uVar6 = Write<unsigned_int>(local_38);
  uVar7 = Write<unsigned_int>(&mesh->mMaterialIndex);
  local_6c = (uint)(mesh->mVertices != (aiVector3D *)0x0);
  if (mesh->mNormals != (aiVector3D *)0x0) {
    local_6c = local_6c | 2;
  }
  if ((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) {
    local_6c = local_6c | 4;
  }
  for (lVar11 = 0; (lVar11 != 8 && (mesh->mTextureCoords[lVar11] != (aiVector3D *)0x0));
      lVar11 = lVar11 + 1) {
    local_6c = local_6c | 0x100 << ((byte)lVar11 & 0x1f);
  }
  for (lVar11 = 0; (lVar11 != 8 && (mesh->mColors[lVar11] != (aiColor4D *)0x0)); lVar11 = lVar11 + 1
      ) {
    local_6c = local_6c | 0x10000 << ((byte)lVar11 & 0x1f);
  }
  uVar8 = Write<unsigned_int>(&local_6c);
  uVar14 = uVar4 + uVar3 + uVar6 + uVar5 + uVar7 + uVar8;
  local_68 = (ulong)uVar14;
  paVar2 = mesh->mVertices;
  if (paVar2 != (aiVector3t<float> *)0x0) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiVector3t<float>>(paVar2,*w);
      local_68 = (ulong)(uVar3 + uVar14);
    }
    else {
      sVar10 = fwrite(paVar2,1,(ulong)(*w * 0xc),(FILE *)out);
      local_68 = (ulong)(uVar14 + (int)sVar10);
    }
  }
  paVar2 = mesh->mNormals;
  if (paVar2 != (aiVector3t<float> *)0x0) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiVector3t<float>>(paVar2,*w);
      local_68 = (ulong)(uVar3 + (int)local_68);
    }
    else {
      sVar10 = fwrite(paVar2,1,(ulong)(*w * 0xc),(FILE *)out);
      local_68 = (ulong)(uint)((int)local_68 + (int)sVar10);
    }
  }
  paVar2 = mesh->mTangents;
  if ((paVar2 != (aiVector3t<float> *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiVector3t<float>>(paVar2,*w);
      uVar4 = WriteBounds<aiVector3t<float>>(mesh->mBitangents,mesh->mNumVertices);
      local_68 = (ulong)(uVar4 + uVar3 + (int)local_68);
    }
    else {
      sVar10 = fwrite(paVar2,1,(ulong)(*w * 0xc),(FILE *)out);
      sVar9 = fwrite(mesh->mBitangents,1,(ulong)(mesh->mNumVertices * 0xc),(FILE *)out);
      local_68 = (ulong)(uint)((int)sVar9 + (int)local_68 + (int)sVar10);
    }
  }
  for (lVar11 = 0; (lVar11 != 8 && (in = mesh->mColors[lVar11], in != (aiColor4t<float> *)0x0));
      lVar11 = lVar11 + 1) {
    if (shortened == true) {
      uVar3 = WriteBounds<aiColor4t<float>>(in,*w);
    }
    else {
      sVar10 = fwrite(in,(ulong)(*w << 4),1,(FILE *)out);
      uVar3 = (uint32_t)sVar10;
    }
    local_68 = (ulong)((int)local_68 + uVar3);
  }
  for (lVar11 = 0; (lVar11 != 0x20 && (*(long *)((long)mesh->mTextureCoords + lVar11 * 2) != 0));
      lVar11 = lVar11 + 4) {
    uVar3 = Write<unsigned_int>((uint *)((long)mesh->mNumUVComponents + lVar11));
    paVar2 = *(aiVector3t<float> **)((long)mesh->mTextureCoords + lVar11 * 2);
    if (shortened == true) {
      uVar4 = WriteBounds<aiVector3t<float>>(paVar2,*w);
    }
    else {
      sVar10 = fwrite(paVar2,(ulong)(*w * 0xc),1,(FILE *)out);
      uVar4 = (uint32_t)sVar10;
    }
    local_68 = (ulong)(uVar3 + (int)local_68 + uVar4);
  }
  uVar13 = local_68;
  local_40 = mesh;
  if (shortened == false) {
    uVar15 = 0;
    while (mesh = local_40, uVar15 < *local_48) {
      paVar1 = local_40->mFaces + uVar15;
      hash = CONCAT22(hash._2_2_,(short)local_40->mFaces[uVar15].mNumIndices);
      local_58 = uVar15;
      uVar3 = Write<unsigned_short>((uint16_t *)&hash);
      uVar14 = (int)uVar13 + uVar3;
      lVar11 = 0;
      for (uVar15 = 0; uVar13 = (ulong)uVar14, uVar15 < paVar1->mNumIndices; uVar15 = uVar15 + 1) {
        if (*w < 0x10000) {
          hash = CONCAT22(hash._2_2_,*(undefined2 *)((long)paVar1->mIndices + lVar11));
          uVar3 = Write<unsigned_short>((uint16_t *)&hash);
        }
        else {
          uVar3 = Write<unsigned_int>((uint *)((long)paVar1->mIndices + lVar11));
        }
        uVar14 = uVar14 + uVar3;
        lVar11 = lVar11 + 4;
      }
      uVar15 = local_58 + 1;
    }
  }
  else {
    uVar14 = 0;
    while( true ) {
      uVar12 = *local_48 - uVar14;
      if (0x1ff < uVar12) {
        uVar12 = 0x200;
      }
      if (*local_48 == uVar14) break;
      hash = 0;
      local_58 = (ulong)uVar12;
      local_68 = uVar13;
      local_4c = uVar12;
      for (uVar15 = 0; uVar15 != local_58; uVar15 = uVar15 + 1) {
        uVar12 = (int)uVar15 + uVar14;
        paVar1 = mesh->mFaces + uVar12;
        tmp = mesh->mFaces[uVar12].mNumIndices;
        hash = SuperFastHash((char *)&tmp,4,hash);
        for (uVar13 = 0; uVar13 < paVar1->mNumIndices; uVar13 = uVar13 + 1) {
          tmp = paVar1->mIndices[uVar13];
          hash = SuperFastHash((char *)&tmp,4,hash);
        }
        mesh = local_40;
      }
      uVar3 = Write<unsigned_int>(&hash);
      uVar13 = (ulong)((int)local_68 + uVar3);
      uVar14 = local_4c + uVar14;
    }
  }
  uVar3 = (uint32_t)uVar13;
  uVar14 = *local_38;
  if (uVar14 != 0) {
    for (uVar15 = 0; uVar3 = (uint32_t)uVar13, uVar15 < uVar14; uVar15 = uVar15 + 1) {
      uVar4 = WriteBinaryBone(mesh->mBones[uVar15]);
      uVar13 = (ulong)(uVar3 + uVar4 + 8);
      uVar14 = mesh->mNumBones;
    }
  }
  ChangeInteger(local_50,uVar3);
  return uVar3;
}

Assistant:

uint32_t WriteBinaryMesh(const aiMesh* mesh)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMESH);

	len += Write<unsigned int>(mesh->mPrimitiveTypes);
	len += Write<unsigned int>(mesh->mNumVertices);
	len += Write<unsigned int>(mesh->mNumFaces);
	len += Write<unsigned int>(mesh->mNumBones);
	len += Write<unsigned int>(mesh->mMaterialIndex);

	// first of all, write bits for all existent vertex components
	unsigned int c = 0;
	if (mesh->mVertices) {
		c |= ASSBIN_MESH_HAS_POSITIONS;
	}
	if (mesh->mNormals) {
		c |= ASSBIN_MESH_HAS_NORMALS;
	}
	if (mesh->mTangents && mesh->mBitangents) {
		c |= ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS;
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
		if (!mesh->mTextureCoords[n]) {
			break;
		}
		c |= ASSBIN_MESH_HAS_TEXCOORD(n);
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
		if (!mesh->mColors[n]) {
			break;
		}
		c |= ASSBIN_MESH_HAS_COLOR(n);
	}
	len += Write<unsigned int>(c);

	aiVector3D minVec, maxVec;
	if (mesh->mVertices) {
		if (shortened) {
			len += WriteBounds(mesh->mVertices,mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mVertices,1,12*mesh->mNumVertices,out));
	}
	if (mesh->mNormals) {
		if (shortened) {
			len += WriteBounds(mesh->mNormals,mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mNormals,1,12*mesh->mNumVertices,out));
	}
	if (mesh->mTangents && mesh->mBitangents) {
		if (shortened) {
			len += WriteBounds(mesh->mTangents,mesh->mNumVertices);
			len += WriteBounds(mesh->mBitangents,mesh->mNumVertices);
		} // else write as usual
		else {
			len += static_cast<uint32_t>(fwrite(mesh->mTangents,1,12*mesh->mNumVertices,out));
			len += static_cast<uint32_t>(fwrite(mesh->mBitangents,1,12*mesh->mNumVertices,out));
		}
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
		if (!mesh->mColors[n])
			break;

		if (shortened) {
			len += WriteBounds(mesh->mColors[n],mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mColors[n],16*mesh->mNumVertices,1,out));
	}
	for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
		if (!mesh->mTextureCoords[n])
			break;

		// write number of UV components
		len += Write<unsigned int>(mesh->mNumUVComponents[n]);

		if (shortened) {
			len += WriteBounds(mesh->mTextureCoords[n],mesh->mNumVertices);
		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(mesh->mTextureCoords[n],12*mesh->mNumVertices,1,out));
	}

	// write faces. There are no floating-point calculations involved
	// in these, so we can write a simple hash over the face data
	// to the dump file. We generate a single 32 Bit hash for 512 faces
	// using Assimp's standard hashing function.
	if (shortened) {
		unsigned int processed = 0;
		for (unsigned int job;(job = std::min(mesh->mNumFaces-processed,512u));processed += job) {

			uint32_t hash = 0;
			for (unsigned int a = 0; a < job;++a) {

				const aiFace& f = mesh->mFaces[processed+a];
				uint32_t tmp = f.mNumIndices;
				hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
				for (unsigned int i = 0; i < f.mNumIndices; ++i) {
					static_assert(AI_MAX_VERTICES <= 0xffffffff, "AI_MAX_VERTICES <= 0xffffffff");
					tmp = static_cast<uint32_t>( f.mIndices[i] );
					hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
				}
			}
			len += Write<unsigned int>(hash);
		}
	}
	else // else write as usual
	{
		// if there are less than 2^16 vertices, we can simply use 16 bit integers ...
		for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
			const aiFace& f = mesh->mFaces[i];

			static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
			len += Write<uint16_t>(f.mNumIndices);

			for (unsigned int a = 0; a < f.mNumIndices;++a) {
				if (mesh->mNumVertices < (1u<<16)) {
					len += Write<uint16_t>(f.mIndices[a]);
				}
				else len += Write<unsigned int>(f.mIndices[a]);
			}
		}
	}

	// write bones
	if (mesh->mNumBones) {
		for (unsigned int a = 0; a < mesh->mNumBones;++a) {
			const aiBone* b = mesh->mBones[a];
			len += WriteBinaryBone(b)+8;
		}
	}

	ChangeInteger(old,len);
	return len;
}